

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UChar * __thiscall
icu_63::Normalizer2Impl::getDecomposition
          (Normalizer2Impl *this,UChar32 c,UChar *buffer,int32_t *length)

{
  undefined2 uVar1;
  ushort uVar2;
  uint uVar3;
  int32_t iVar4;
  UChar *pUVar5;
  ushort *puVar6;
  
  if (c < (int)(uint)(ushort)this->minDecompNoCP) {
    pUVar5 = (UChar *)0x0;
  }
  else {
    uVar2 = getNorm16(this,c);
    if (uVar2 < this->minMaybeYes) {
      if (uVar2 < this->limitNoNo) {
        pUVar5 = (UChar *)0x0;
      }
      else {
        c = (c + (uint)(uVar2 >> 3)) - (uint)this->centerNoNoDelta;
        if ((uint)c < 0x10000) {
          iVar4 = 1;
          uVar3 = c;
        }
        else {
          uVar3 = ((uint)c >> 10) - 0x2840;
          buffer[1] = (ushort)c & 0x3ff | 0xdc00;
          iVar4 = 2;
        }
        *length = iVar4;
        *buffer = (UChar)uVar3;
        uVar2 = getRawNorm16(this,c);
        pUVar5 = buffer;
      }
      if (this->minYesNo <= uVar2) {
        if ((uVar2 == this->minYesNo) || (uVar1 = this->minYesNoMappingsOnly, (uVar1 | 1) == uVar2))
        {
          iVar4 = Hangul::decompose(c,buffer);
          *length = iVar4;
          pUVar5 = buffer;
        }
        else {
          puVar6 = (ushort *)((long)this->extraData + (ulong)(uVar2 & 0xfffe));
          pUVar5 = (UChar *)(puVar6 + 1);
          *length = *puVar6 & 0x1f;
        }
      }
    }
    else {
      pUVar5 = (UChar *)0x0;
    }
  }
  return pUVar5;
}

Assistant:

const UChar *
Normalizer2Impl::getDecomposition(UChar32 c, UChar buffer[4], int32_t &length) const {
    uint16_t norm16;
    if(c<minDecompNoCP || isMaybeOrNonZeroCC(norm16=getNorm16(c))) {
        // c does not decompose
        return nullptr;
    }
    const UChar *decomp = nullptr;
    if(isDecompNoAlgorithmic(norm16)) {
        // Maps to an isCompYesAndZeroCC.
        c=mapAlgorithmic(c, norm16);
        decomp=buffer;
        length=0;
        U16_APPEND_UNSAFE(buffer, length, c);
        // The mapping might decompose further.
        norm16 = getRawNorm16(c);
    }
    if (norm16 < minYesNo) {
        return decomp;
    } else if(isHangulLV(norm16) || isHangulLVT(norm16)) {
        // Hangul syllable: decompose algorithmically
        length=Hangul::decompose(c, buffer);
        return buffer;
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    length=*mapping&MAPPING_LENGTH_MASK;
    return (const UChar *)mapping+1;
}